

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O2

int testDatumArrayConversions(void)

{
  VRCORETYPE_ID VVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  float extraout_XMM0_Da;
  VRFloatArray g;
  VRIntArray e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c;
  string b;
  VRString local_188;
  VRDatumString a;
  VRDatumInt d;
  VRDatumFloat f;
  
  iVar7 = 0;
  iVar6 = 10;
  while( true ) {
    bVar8 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar8) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"this is a string",(allocator<char> *)&d);
    MinVR::VRDatumString::VRDatumString(&a,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::string
              ((string *)&d,
               (string *)
               &a.
                super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                .super_VRDatum.description);
    iVar2 = std::__cxx11::string::compare((char *)&d);
    std::__cxx11::string::~string((string *)&d);
    (*a.
      super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
      .super_VRDatum._vptr_VRDatum[2])(&b,&a);
    (*a.
      super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
      .super_VRDatum._vptr_VRDatum[0xf])(&c,&a);
    iVar3 = std::__cxx11::string::compare
                      ((string *)
                       c.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    VVar1 = a.
            super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
            .super_VRDatum.type;
    std::__cxx11::string::string
              ((string *)&d,
               (string *)
               (a.
                super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                .value.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next + 1));
    iVar4 = std::__cxx11::string::compare((char *)&d);
    std::__cxx11::string::~string((string *)&d);
    MinVR::VRDatumInt::VRDatumInt(&d,0x25);
    (*d.super_VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>.super_VRDatum_conflict._vptr_VRDatum
      [0xb])(&e,(string *)&d);
    iVar7 = *e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar5 = (*d.super_VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>.super_VRDatum_conflict.
              _vptr_VRDatum[6])((string *)&d);
    MinVR::VRDatumFloat::VRDatumFloat(&f,3.1415925);
    (*f.super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>.super_VRDatum_conflict.
      _vptr_VRDatum[0xd])(&g,(VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)&f);
    (*f.super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>.super_VRDatum_conflict.
      _vptr_VRDatum[8])((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)&f);
    *g.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         extraout_XMM0_Da;
    iVar7 = (uint)(iVar7 != iVar5) + iVar3 + iVar2 + iVar4 + (uint)(VVar1 != VRCORETYPE_STRING) +
            (uint)(extraout_XMM0_Da == 0.0);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&g.super__Vector_base<float,_std::allocator<float>_>);
    MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::~VRDatumSpecialized
              ((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)&f);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&e.super__Vector_base<int,_std::allocator<int>_>);
    MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::~VRDatumSpecialized
              ((VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *)&d);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&c);
    std::__cxx11::string::~string((string *)&b);
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::~VRDatumSpecialized
              (&a.
                super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
              );
  }
  return iVar7;
}

Assistant:

int testDatumArrayConversions() {

  int out = 0;

  LOOP {

    MinVR::VRDatumString a = MinVR::VRDatumString(std::string("this is a string"));

    out = a.getDescription().compare("string");

    std::string b = a.getValue();

    std::vector<std::string> c = a.getValue();

    out += c[0].compare(b);

    out += (a.getType() == MinVR::VRCORETYPE_STRING) ? 0 : 1;

    out += a.getValueString().compare("this is a string");

    MinVR::VRDatumInt d = MinVR::VRDatumInt(37);

    MinVR::VRIntArray e = d.getValue();

    out += (e[0] == (MinVR::VRInt)d.getValue()) ? 0 : 1;

    MinVR::VRDatumFloat f = MinVR::VRDatumFloat(3.1415926f);

    MinVR::VRFloatArray g = f.getValue();

    out += (g[0] = (MinVR::VRFloat)f.getValue()) ? 0 : 1;

  }